

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAPrivateKey.cpp
# Opt level: O0

ByteString * __thiscall DSAPrivateKey::serialise(DSAPrivateKey *this)

{
  ByteString *in_RDI;
  ByteString *in_stack_ffffffffffffff00;
  ByteString *in_stack_ffffffffffffff08;
  ByteString *in_stack_ffffffffffffff28;
  
  ByteString::serialise(in_stack_ffffffffffffff28);
  ByteString::serialise(in_stack_ffffffffffffff28);
  operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  ByteString::serialise(in_stack_ffffffffffffff28);
  operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  ByteString::serialise(in_stack_ffffffffffffff28);
  operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  ByteString::~ByteString((ByteString *)0x1a682a);
  ByteString::~ByteString((ByteString *)0x1a6837);
  ByteString::~ByteString((ByteString *)0x1a6841);
  ByteString::~ByteString((ByteString *)0x1a684e);
  ByteString::~ByteString((ByteString *)0x1a6858);
  ByteString::~ByteString((ByteString *)0x1a6865);
  return in_RDI;
}

Assistant:

ByteString DSAPrivateKey::serialise() const
{
	return p.serialise() +
	       q.serialise() +
	       g.serialise() +
	       x.serialise();
}